

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::get_subcommand(App *this,string *subcom)

{
  bool bVar1;
  pointer pAVar2;
  OptionNotFound *this_00;
  string local_88;
  string local_58;
  reference local_38;
  App_p *subcomptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range2;
  string *subcom_local;
  App *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ::begin(&this->subcommands_);
  subcomptr = (App_p *)std::
                       vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                       ::end(&this->subcommands_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                *)&subcomptr);
    if (!bVar1) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_88,(string *)subcom);
      OptionNotFound::OptionNotFound(this_00,&local_88);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
               ::operator*(&__end2);
    pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
    ::std::__cxx11::string::string((string *)&local_58,(string *)subcom);
    bVar1 = check_name(pAVar2,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
    ::operator++(&__end2);
  }
  pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(local_38);
  return pAVar2;
}

Assistant:

App *get_subcommand(std::string subcom) const {
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr->check_name(subcom))
                return subcomptr.get();
        throw OptionNotFound(subcom);
    }